

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
SMBusSimulationDataGenerator::OutputBlockProcessCallPMBusQuery(SMBusSimulationDataGenerator *this)

{
  U8 byte;
  byte bVar1;
  byte bVar2;
  bool bVar3;
  U8 pec;
  SMBusSimulationDataGenerator *this_local;
  
  OutputStart(this);
  bVar1 = OutputAddr(this,'C',false,true);
  bVar1 = ""[(int)(uint)bVar1];
  bVar2 = OutputByte(this,'\x1a',true);
  bVar1 = ""[(int)(uint)(bVar1 ^ bVar2)];
  bVar2 = OutputByte(this,'\x01',true);
  bVar1 = ""[(int)(uint)(bVar1 ^ bVar2)];
  bVar2 = OutputByte(this,'\x03',true);
  bVar1 = ""[(int)(uint)(bVar1 ^ bVar2)];
  OutputStart(this);
  bVar2 = OutputAddr(this,'C',true,true);
  bVar1 = ""[(int)(uint)(bVar1 ^ bVar2)];
  bVar2 = OutputByte(this,'\x01',true);
  bVar1 = ""[(int)(uint)(bVar1 ^ bVar2)];
  bVar3 = SMBusAnalyzerSettings::CalcPEC(this->mSettings);
  bVar2 = OutputByte(this,0x98,bVar3);
  byte = ""[(int)(uint)(bVar1 ^ bVar2)];
  bVar3 = SMBusAnalyzerSettings::CalcPEC(this->mSettings);
  if (bVar3) {
    OutputByte(this,byte,false);
  }
  OutputStop(this);
  AdvanceAllBySec(this,0.0005);
  return;
}

Assistant:

void SMBusSimulationDataGenerator::OutputBlockProcessCallPMBusQuery()
{
    U8 pec = 0;

    OutputStart();
    pec = SMBusCRCLookup[ pec ^ OutputAddr( 0x43, false ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( QUERY ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( 0x01 ) ];         // block command byte count
    pec = SMBusCRCLookup[ pec ^ OutputByte( CLEAR_FAULTS ) ]; // 1 data byte is the command to query
    OutputStart();
    pec = SMBusCRCLookup[ pec ^ OutputAddr( 0x43, true ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( 0x01 ) ];                       // block command byte count
    pec = SMBusCRCLookup[ pec ^ OutputByte( 0x98, mSettings->CalcPEC() ) ]; // the result
    if( mSettings->CalcPEC() )
        OutputByte( pec, false );
    OutputStop();

    AdvanceAllBySec( ONE_MS * 0.5 );
}